

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O2

void psnrCharts(TRIPLEYCbCr **mrxYCbCr,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo)

{
  FILE *pFVar1;
  TRIPLEBYTES **ppTVar2;
  int sigma;
  uint uVar3;
  double dVar4;
  double dVar5;
  
  pFVar1 = fopen("lab2/noize/chartPSNRGause/psnr.csv","w");
  for (uVar3 = 1; uVar3 != 0x32; uVar3 = uVar3 + 1) {
    fprintf(pFVar1,"%d,",(ulong)uVar3);
  }
  fputc(10,pFVar1);
  dVar4 = 1.0;
  for (uVar3 = 1; uVar3 != 0x32; uVar3 = uVar3 + 1) {
    ppTVar2 = gause_noise((TRIPLEBYTES **)mrxYCbCr,bmInfo.biHeight,bmInfo.biWidth,dVar4,0);
    dVar5 = getPSNR((TRIPLEBYTES **)mrxYCbCr,ppTVar2,0,0,bmInfo.biHeight,bmInfo.biWidth,0);
    printf("sigma: %d\tPSNR[gauseNoize ; origin ] - %f\n",(ulong)uVar3);
    fprintf(pFVar1,"%4.2f,",dVar5);
    clear_memory((TRIPLEYCbCr **)ppTVar2,bmInfo.biHeight);
    dVar4 = dVar4 + 1.0;
  }
  fclose(pFVar1);
  pFVar1 = fopen("lab2/noize/chartPSNRImpulse/psnr.csv","w");
  for (dVar4 = 0.1; dVar4 <= 1.0; dVar4 = dVar4 + 0.1) {
    fprintf(pFVar1,"%4.2f,",dVar4);
  }
  fputc(10,pFVar1);
  for (dVar4 = 0.1; dVar4 <= 1.0; dVar4 = dVar4 + 0.1) {
    ppTVar2 = impulse_noise((TRIPLEBYTES **)mrxYCbCr,bmInfo.biHeight,bmInfo.biWidth,0,dVar4 * 0.5,
                            dVar4 * 0.5);
    dVar5 = getPSNR((TRIPLEBYTES **)mrxYCbCr,ppTVar2,0,0,bmInfo.biHeight,bmInfo.biWidth,0);
    printf("prob: %f\tPSNR[gauseNoize ; origin ] - %f\n",dVar4,dVar5);
    fprintf(pFVar1,"%4.2f,",dVar5);
    clear_memory((TRIPLEYCbCr **)ppTVar2,bmInfo.biHeight);
  }
  fclose(pFVar1);
  return;
}

Assistant:

void psnrCharts(TRIPLEYCbCr **mrxYCbCr, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo) {
    int min = 1;
    int max = 50;
    int step = 1;
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    FILE *file = fopen("lab2/noize/chartPSNRGause/psnr.csv", "w");
    TRIPLEYCbCr **mrxGauseNoize;
    for (int sigma = min; sigma < max; sigma += step) {
        fprintf(file, "%d,", sigma);
    }
    fprintf(file, "\n");
    for (int sigma = min; sigma < max; sigma += step) {
        mrxGauseNoize = (TRIPLEYCbCr **) gause_noise((TRIPLEBYTES **) mrxYCbCr, bmInfo.biHeight,
                                                     bmInfo.biWidth, sigma, COMPONENT_Y);
        //printf("get noize\n");
        double psnr = getPSNR((TRIPLEBYTES **) mrxYCbCr, (TRIPLEBYTES **) mrxGauseNoize, 0, 0, h, w,
                              COMPONENT_Y);
        printf("sigma: %d\tPSNR[gauseNoize ; origin ] - %f\n", sigma, psnr);
        fprintf(file, "%4.2f,", psnr);
        clear_memory(mrxGauseNoize, h);
    }
    fclose(file);

    FILE *file2 = fopen("lab2/noize/chartPSNRImpulse/psnr.csv", "w");
    TRIPLEYCbCr **mrxImpulseNoize;
    for (double prob = 0.1; prob <= 1; prob += 0.1) {
        fprintf(file2, "%4.2f,", prob);
    }
    fprintf(file2, "\n");
    for (double prob = 0.1; prob <= 1; prob += 0.1) {
        mrxImpulseNoize = (TRIPLEYCbCr **) impulse_noise((TRIPLEBYTES **) mrxYCbCr, bmInfo.biHeight,
                                                         bmInfo.biWidth, COMPONENT_Y, prob / 2, prob / 2);
        //printf("get noize\n");
        double psnr = getPSNR((TRIPLEBYTES **) mrxYCbCr, (TRIPLEBYTES **) mrxImpulseNoize, 0, 0, h, w,
                              COMPONENT_Y);
        printf("prob: %f\tPSNR[gauseNoize ; origin ] - %f\n", prob, psnr);
        fprintf(file2, "%4.2f,", psnr);
        clear_memory(mrxImpulseNoize, h);
    }
    fclose(file2);
}